

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall simple_json::Stream::emit_json_key_value(Stream *this,string *key,float value)

{
  spirv_cross local_40 [36];
  float local_1c;
  string *psStack_18;
  float value_local;
  string *key_local;
  Stream *this_local;
  
  local_1c = value;
  psStack_18 = key;
  key_local = (string *)this;
  emit_json_key(this,key);
  spirv_cross::convert_to_string_abi_cxx11_(local_40,local_1c,this->current_locale_radix_character);
  statement_inner<std::__cxx11::string>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Stream::emit_json_key_value(const std::string &key, float value)
{
	emit_json_key(key);
	statement_inner(convert_to_string(value, current_locale_radix_character));
}